

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P11Objects.cpp
# Opt level: O0

int __thiscall P11DESSecretKeyObj::init(P11DESSecretKeyObj *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ulong uVar2;
  CK_KEY_TYPE CVar3;
  P11DESSecretKeyObj *this_00;
  mapped_type *ppPVar4;
  EVP_PKEY_CTX *ctx_00;
  P11Attribute *attrValue;
  OSAttribute setKeyType;
  unsigned_long in_stack_fffffffffffffef8;
  OSAttribute *in_stack_ffffffffffffff00;
  OSObject *in_stack_ffffffffffffff08;
  key_type *in_stack_ffffffffffffff38;
  map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
  *in_stack_ffffffffffffff40;
  undefined1 local_b8 [160];
  EVP_PKEY_CTX *local_18;
  P11DESSecretKeyObj *local_10;
  undefined1 local_1;
  
  if (((this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.field_0x43 & 1) == 0) {
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      local_1 = 0;
    }
    else {
      local_18 = ctx;
      local_10 = this;
      uVar2 = (**(code **)(*(long *)ctx + 0x10))(ctx,0x100);
      if (((uVar2 & 1) == 0) ||
         (CVar3 = (**(code **)(*(long *)local_18 + 0x28))(local_18,0x100,0x80000000),
         CVar3 != this->keytype)) {
        OSAttribute::OSAttribute(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        (**(code **)(*(long *)local_18 + 0x40))(local_18,0x100,local_b8);
        OSAttribute::~OSAttribute(in_stack_ffffffffffffff00);
      }
      uVar1 = P11SecretKeyObj::init(&this->super_P11SecretKeyObj,local_18);
      if ((uVar1 & 1) == 0) {
        local_1 = 0;
        this = (P11DESSecretKeyObj *)(ulong)uVar1;
      }
      else {
        this_00 = (P11DESSecretKeyObj *)operator_new(0x28);
        ctx_00 = (EVP_PKEY_CTX *)
                 (this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.osobject;
        P11AttrValue::P11AttrValue
                  ((P11AttrValue *)this_00,in_stack_ffffffffffffff08,
                   (CK_ULONG)in_stack_ffffffffffffff00);
        uVar1 = P11Attribute::init((P11Attribute *)this_00,ctx_00);
        if ((uVar1 & 1) == 0) {
          softHSMLog(3,"init",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/P11Objects.cpp"
                     ,0x68d,"Could not initialize the attribute");
          if (this_00 != (P11DESSecretKeyObj *)0x0) {
            uVar1 = (*(this_00->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.
                      _vptr_P11Object[1])();
            this_00 = (P11DESSecretKeyObj *)(ulong)uVar1;
          }
          local_1 = 0;
          this = this_00;
        }
        else {
          P11Attribute::getType((P11Attribute *)this_00);
          ppPVar4 = std::
                    map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                    ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          *ppPVar4 = (mapped_type)this_00;
          (this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.field_0x43 = 1;
          local_1 = 1;
        }
      }
    }
  }
  else {
    local_1 = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool P11DESSecretKeyObj::init(OSObject *inobject)
{
	if (initialized) return true;
	if (inobject == NULL) return false;

	if (!inobject->attributeExists(CKA_KEY_TYPE) || inobject->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != keytype) {
		OSAttribute setKeyType(keytype);
		inobject->setAttribute(CKA_KEY_TYPE, setKeyType);
	}

	// Create parent
	if (!P11SecretKeyObj::init(inobject)) return false;

	// Create attributes
	P11Attribute* attrValue = new P11AttrValue(osobject,P11Attribute::ck1|P11Attribute::ck4|P11Attribute::ck6|P11Attribute::ck7);

	// Initialize the attributes
	if (!attrValue->init())
	{
		ERROR_MSG("Could not initialize the attribute");
		delete attrValue;
		return false;
	}

	// Add them to the map
	attributes[attrValue->getType()] = attrValue;

	initialized = true;
	return true;
}